

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  sqlite3_stmt **ppStmt;
  Fts3TokenAndCost *pFVar1;
  undefined8 *puVar2;
  void *p;
  Fts3TokenAndCost *pFVar3;
  sqlite3_vtab_cursor *psVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  sqlite3_vtab *psVar9;
  byte *pbVar10;
  i64 iVar11;
  size_t sVar12;
  Fts3Expr *pFVar13;
  Fts3Expr *pFVar14;
  Fts3Expr *pFVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  Fts3Phrase *pFVar20;
  sqlite3_vtab *psVar21;
  uint uVar22;
  uchar uVar23;
  uchar uVar24;
  Fts3Expr *pFVar25;
  ulong in_R11;
  ulong uVar26;
  ulong uVar27;
  byte *pbVar28;
  sqlite3_value *pVal;
  long lVar29;
  sqlite3_value *pMem;
  long lVar30;
  int iVar31;
  byte *__s1;
  Fts3Expr **__dest;
  bool bVar32;
  undefined1 uVar33;
  bool bVar34;
  int nToken;
  int iEnd;
  sqlite3_tokenizer_cursor *pCursor_1;
  char *zByte;
  int local_124;
  char local_11d;
  int local_11c;
  undefined8 local_118;
  Fts3Cursor *local_110;
  uint local_104;
  byte *local_100;
  Fts3Expr *local_f8;
  byte *local_f0;
  Fts3Expr *local_e8;
  ulong local_e0;
  uint local_d4;
  Fts3Expr *local_d0;
  uint local_c8;
  undefined4 local_c4;
  Fts3Expr *local_c0;
  Fts3Expr *local_b8;
  sqlite3_vtab *local_b0;
  Fts3Expr *local_a8;
  Fts3Expr *local_a0;
  uint local_94;
  sqlite3_value *local_90;
  Fts3TokenAndCost *local_88;
  long local_80;
  sqlite3_vtab_cursor *local_78;
  sqlite3_value *local_70;
  sqlite3_module *local_68;
  sqlite3_value *local_60;
  int local_54;
  i64 local_50;
  ulong local_48;
  byte *local_40;
  long local_38;
  
  local_c8 = idxNum & 0xffff;
  if (local_c8 == 0) {
    local_70 = (sqlite3_value *)0x0;
  }
  else {
    local_70 = *apVal;
  }
  uVar22 = (uint)(local_c8 != 0);
  if (((uint)idxNum >> 0x10 & 1) == 0) {
    pMem = (Mem *)0x0;
  }
  else {
    uVar26 = (ulong)uVar22;
    uVar22 = uVar22 + 1;
    pMem = apVal[uVar26];
  }
  if (((uint)idxNum >> 0x11 & 1) == 0) {
    local_60 = (sqlite3_value *)0x0;
  }
  else {
    uVar26 = (ulong)uVar22;
    uVar22 = uVar22 + 1;
    local_60 = apVal[uVar26];
  }
  if (((uint)idxNum >> 0x12 & 1) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar22];
  }
  psVar21 = pCursor->pVtab;
  local_94 = idxNum;
  sqlite3_finalize((sqlite3_stmt *)pCursor[2].pVtab);
  sqlite3_free(pCursor[8].pVtab);
  sqlite3_free(pCursor[0xf].pVtab);
  sqlite3Fts3ExprFree((Fts3Expr *)pCursor[3].pVtab);
  memset(pCursor + 1,0,0x88);
  psVar9 = (sqlite3_vtab *)fts3DocidRange(local_60,-0x8000000000000000);
  pCursor[0xc].pVtab = psVar9;
  psVar9 = (sqlite3_vtab *)fts3DocidRange(pVal,0x7fffffffffffffff);
  pCursor[0xd].pVtab = psVar9;
  if (idxStr == (char *)0x0) {
    uVar33 = psVar21[0x12].field_0xf;
  }
  else {
    uVar33 = *idxStr == 'D';
  }
  *(undefined1 *)((long)&pCursor[9].pVtab + 4) = uVar33;
  *(short *)&pCursor[1].pVtab = (short)local_94;
  if (1 < local_c8) {
    pbVar10 = (byte *)sqlite3ValueText(local_70,'\x01');
    if ((pbVar10 == (byte *)0x0) &&
       (uVar22._0_2_ = local_70->flags, uVar22._2_1_ = local_70->enc,
       uVar22._3_1_ = local_70->field_0xb, (0xaaaaaaaaU >> (uVar22 & 0x1f) & 1) == 0)) {
      return 7;
    }
    *(undefined4 *)&pCursor[4].pVtab = 0;
    if (pMem == (Mem *)0x0) {
      iVar11 = 0;
    }
    else {
      iVar11 = sqlite3VdbeIntValue(pMem);
      *(int *)&pCursor[4].pVtab = (int)iVar11;
    }
    local_110 = (Fts3Cursor *)pCursor;
    local_b0 = psVar21;
    local_90 = pVal;
    if (pbVar10 == (byte *)0x0) {
      pCursor[3].pVtab = (sqlite3_vtab *)0x0;
LAB_00179e14:
      pFVar15 = (Fts3Expr *)0x0;
    }
    else {
      local_c8 = local_c8 - 2;
      local_38 = *(long *)&psVar21[2].nRef;
      local_68 = psVar21[3].pModule;
      local_48 = (ulong)*(uint *)&psVar21[2].pModule;
      local_11d = psVar21[0x12].field_0xc;
      local_78 = pCursor + 3;
      local_50 = iVar11;
      sVar12 = strlen((char *)pbVar10);
      local_d4 = 1;
      local_a0 = (Fts3Expr *)0x0;
      pFVar15 = (Fts3Expr *)0x0;
      local_b8 = (Fts3Expr *)0x0;
      pbVar28 = pbVar10;
      local_100 = pbVar10;
      do {
        uVar22 = (uint)sVar12;
        uVar26 = sVar12 & 0xffffffff;
        __s1 = pbVar10;
        local_e0 = sVar12;
        if ((int)uVar22 < 1) {
          if (uVar22 == 0) {
LAB_00179d92:
            iVar7 = 0x65;
            pCursor = &local_110->base;
            break;
          }
        }
        else {
          while( true ) {
            uVar22 = (uint)uVar26;
            if ((4 < *__s1 - 9) && (*__s1 != 0x20)) break;
            __s1 = __s1 + 1;
            uVar26 = (ulong)(uVar22 - 1);
            if ((int)uVar22 < 2) goto LAB_00179d92;
          }
        }
        local_80 = (long)__s1 - (long)pbVar10;
        local_c0 = (Fts3Expr *)0x0;
        local_e8 = (Fts3Expr *)((ulong)local_e8 & 0xffffffff00000000);
        lVar30 = 0;
        local_f8 = pFVar15;
        local_f0 = pbVar10;
        do {
          lVar19 = lVar30 * 0x10;
          if ((&DAT_001b0c59)[lVar19] == '\0') {
            uVar26 = (ulong)(byte)(&DAT_001b0c58)[lVar19];
            pVal = local_90;
            if (((int)(uint)(byte)(&DAT_001b0c58)[lVar19] <= (int)uVar22) &&
               (iVar7 = bcmp(__s1,(&getNextNode_aKeyword)[lVar30 * 2],uVar26), pbVar10 = local_f0,
               pVal = local_90, iVar7 == 0)) {
              iVar7 = 10;
              if (((byte)(&DAT_001b0c5a)[lVar19] == 1) &&
                 ((__s1[4] == 0x2f && (bVar5 = __s1[5], (byte)(bVar5 - 0x30) < 10)))) {
                iVar7 = 0;
                lVar29 = 6;
                do {
                  iVar7 = (uint)(byte)(bVar5 - 0x30) + iVar7 * 10;
                  bVar5 = __s1[lVar29];
                  lVar29 = lVar29 + 1;
                } while ((byte)(bVar5 - 0x30) < 10);
                uVar26 = (ulong)((int)lVar29 - 1);
              }
              bVar5 = __s1[uVar26];
              uVar27 = (ulong)bVar5;
              if ((uVar27 < 0x2a) && ((0x30500003e01U >> (uVar27 & 0x3f) & 1) != 0)) {
                local_d0 = (Fts3Expr *)(0x30400000001 >> (bVar5 & 0x3f));
                local_118._0_4_ = (uint)(byte)(&DAT_001b0c5a)[lVar19];
                iVar31 = sqlite3_initialize();
                if ((iVar31 == 0) &&
                   (pFVar13 = (Fts3Expr *)sqlite3Malloc(0x40), pFVar13 != (Fts3Expr *)0x0)) {
                  pFVar13->iDocid = 0;
                  pFVar13->bEof = '\0';
                  pFVar13->bStart = '\0';
                  pFVar13->bDeferred = '\0';
                  *(undefined5 *)&pFVar13->field_0x33 = 0;
                  pFVar13->pRight = (Fts3Expr *)0x0;
                  pFVar13->pPhrase = (Fts3Phrase *)0x0;
                  pFVar13->pParent = (Fts3Expr *)0x0;
                  pFVar13->pLeft = (Fts3Expr *)0x0;
                  pFVar13->aMI = (u32 *)0x0;
                  pFVar13->eType = (uint)local_118;
                  pFVar13->nNear = iVar7;
                  iVar31 = (int)uVar26 + (int)local_80;
                  local_118 = (void *)((ulong)local_118._4_4_ << 0x20);
                  if (((ulong)local_d0 & 1) == 0) {
                    bVar32 = true;
                    iVar8 = (int)local_e0;
                    pCursor = &local_110->base;
                    pbVar28 = local_100;
                    pFVar15 = local_f8;
                    goto LAB_00179abe;
                  }
                  local_e8 = (Fts3Expr *)CONCAT44(local_e8._4_4_,iVar31);
                  local_c0 = pFVar13;
                }
                else {
                  local_118 = (void *)CONCAT44(local_118._4_4_,7);
                  if (((ulong)local_d0 & 1) == 0) {
                    iVar7 = 7;
                    psVar21 = local_b0;
                    pCursor = &local_110->base;
                    pbVar28 = local_100;
                    pVal = local_90;
                    pFVar15 = local_f8;
                    goto LAB_00179d9c;
                  }
                }
              }
              pbVar10 = local_f0;
              pVal = local_90;
              if ((bVar5 < 0x2a) && ((0x30400000001U >> (uVar27 & 0x3f) & 1) != 0)) {
                bVar32 = true;
                iVar8 = (int)local_e0;
                pCursor = &local_110->base;
                pFVar13 = local_c0;
                pbVar28 = local_100;
                pFVar15 = local_f8;
                iVar31 = (int)local_e8;
                goto LAB_00179abe;
              }
            }
          }
          lVar19 = local_38;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        if (*__s1 == 0x22) {
          uVar26 = 1;
          if (1 < (int)uVar22) {
            uVar26 = 1;
            while (__s1[uVar26] != 0x22) {
              uVar26 = uVar26 + 1;
              if (uVar22 == uVar26) goto LAB_0017a19a;
            }
          }
          uVar17 = (uint)uVar26;
          if (uVar17 == uVar22) {
LAB_0017a19a:
            iVar7 = 1;
            psVar21 = local_b0;
            pCursor = &local_110->base;
            pbVar28 = local_100;
            pFVar15 = local_f8;
            break;
          }
          pFVar14 = *(Fts3Expr **)&local_68->iVersion;
          local_a8 = (Fts3Expr *)0x0;
          iVar7 = sqlite3Fts3OpenTokenizer
                            ((sqlite3_tokenizer *)local_68,(int)local_50,(char *)(__s1 + 1),
                             uVar17 - 1,(sqlite3_tokenizer_cursor **)&local_a8);
          if (iVar7 == 0) {
            local_124 = 0;
            local_104 = 0;
            local_11c = 0;
            local_c4 = 0;
            local_e8 = local_a8;
            iVar7 = (*(code *)pFVar14->iDocid)
                              (local_a8,&local_88,&local_124,&local_104,&local_11c,&local_c4);
            if (iVar7 == 0) {
              local_c0 = (Fts3Expr *)0x0;
              lVar30 = 0xa8;
              pFVar13 = (Fts3Expr *)0x0;
              local_118 = (void *)0x0;
              iVar31 = 0;
              local_d0 = pFVar14;
              local_54 = uVar17 - 1;
              local_40 = __s1 + 1;
              do {
                pFVar13 = (Fts3Expr *)fts3ReallocOrFree(pFVar13,(int)lVar30 + 0x18);
                if (pFVar13 == (Fts3Expr *)0x0) {
LAB_00179a61:
                  iVar8 = (int)local_e0;
                  pFVar25 = local_e8;
                  pFVar14 = local_d0;
                  goto LAB_00179a7a;
                }
                local_118 = fts3ReallocOrFree(local_118,local_124 + iVar31);
                if (local_118 == (void *)0x0) {
                  local_118 = (void *)0x0;
                  goto LAB_00179a61;
                }
                puVar2 = (undefined8 *)((long)&pFVar13->eType + lVar30);
                *puVar2 = 0;
                puVar2[1] = 0;
                puVar2 = (undefined8 *)((long)pFVar13 + lVar30 + -0x10);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined8 *)((long)&pFVar13->pLeft + lVar30) = 0;
                memcpy((void *)((long)iVar31 + (long)local_118),local_88,(long)local_124);
                *(int *)((long)pFVar13 + lVar30 + -8) = local_124;
                uVar22 = 0;
                uVar18 = 0;
                if (local_11c < local_54) {
                  uVar18 = (uint)(local_40[local_11c] == 0x2a);
                }
                *(uint *)((long)pFVar13 + lVar30 + -4) = uVar18;
                if (0 < (long)(int)local_104) {
                  uVar22 = (uint)(__s1[(int)local_104] == 0x5e);
                }
                iVar31 = iVar31 + local_124;
                *(uint *)((long)&pFVar13->eType + lVar30) = uVar22;
                local_124 = 0;
                local_104 = 0;
                local_11c = 0;
                local_c4 = 0;
                iVar7 = (*(code *)local_d0->iDocid)
                                  (local_e8,&local_88,&local_124,&local_104,&local_11c,&local_c4);
                local_c0 = (Fts3Expr *)(ulong)((int)local_c0 + 1);
                lVar30 = lVar30 + 0x28;
                pFVar14 = local_d0;
              } while (iVar7 == 0);
            }
            else {
              local_c0 = (Fts3Expr *)0x0;
              iVar31 = 0;
              local_118 = (void *)0x0;
              pFVar13 = (Fts3Expr *)0x0;
            }
            (*(code *)pFVar14->pPhrase)(local_e8);
            local_a8 = (Fts3Expr *)0x0;
            iVar8 = (int)local_e0;
            iVar6 = (int)local_c0;
          }
          else {
            pFVar13 = (Fts3Expr *)0x0;
            local_118 = (void *)0x0;
            iVar31 = 0;
            iVar6 = 0;
            iVar8 = (int)local_e0;
          }
          if (iVar7 == 0x65) {
            pFVar13 = (Fts3Expr *)fts3ReallocOrFree(pFVar13,iVar31 + 0xc0 + iVar6 * 0x28);
            if (pFVar13 == (Fts3Expr *)0x0) {
              pFVar13 = (Fts3Expr *)0x0;
              pFVar25 = local_a8;
LAB_00179a7a:
              pFVar15 = local_f8;
              pCursor = &local_110->base;
              if (pFVar25 != (Fts3Expr *)0x0) {
                (*(code *)pFVar14->pPhrase)();
              }
              sqlite3_free(local_118);
              sqlite3_free(pFVar13);
              local_118 = (void *)CONCAT44(local_118._4_4_,7);
              pFVar13 = (Fts3Expr *)0x0;
            }
            else {
              pFVar20 = (Fts3Phrase *)(pFVar13 + 1);
              memset(pFVar13,0,0x90);
              p = local_118;
              pFVar13->eType = 5;
              pFVar13->pPhrase = pFVar20;
              *(uint *)((long)&pFVar13[2].pLeft + 4) = local_c8;
              *(int *)&pFVar13[2].pLeft = iVar6;
              __dest = &pFVar13[2].pRight + (long)iVar6 * 5;
              if (local_118 != (void *)0x0) {
                memcpy(__dest,local_118,(long)iVar31);
                sqlite3_free(p);
                pFVar20 = pFVar13->pPhrase;
              }
              iVar7 = pFVar20->nToken;
              local_118 = (void *)((ulong)local_118 & 0xffffffff00000000);
              iVar8 = (int)local_e0;
              pCursor = &local_110->base;
              pFVar15 = local_f8;
              if (0 < (long)iVar7) {
                lVar30 = 0;
                do {
                  *(Fts3Expr ***)((long)&pFVar20->aToken[0].z + lVar30) = __dest;
                  __dest = (Fts3Expr **)
                           ((long)__dest + (long)*(int *)((long)&pFVar20->aToken[0].n + lVar30));
                  lVar30 = lVar30 + 0x28;
                } while ((long)iVar7 * 0x28 != lVar30);
              }
            }
          }
          else {
            local_118 = (void *)CONCAT44(local_118._4_4_,iVar7);
            pCursor = &local_110->base;
            pFVar15 = local_f8;
          }
          bVar32 = true;
          pbVar28 = local_100;
          iVar31 = (int)local_80 + uVar17 + 1;
        }
        else {
          uVar26 = 0;
          iVar7 = 0;
          uVar17 = local_c8;
          if (0 < (int)local_48) {
            uVar27 = 0;
            do {
              pcVar16 = *(char **)(lVar19 + uVar27 * 8);
              sVar12 = strlen(pcVar16);
              iVar7 = (int)sVar12;
              if (((iVar7 < (int)uVar22) && (pcVar16 != (char *)0x0)) && (__s1[iVar7] == 0x3a)) {
                if (0 < iVar7) {
                  uVar17 = iVar7 + 1;
                  lVar30 = 0;
                  while ((ulong)(byte)pcVar16[lVar30] != 0) {
                    uVar23 = ""[(byte)pcVar16[lVar30]];
                    uVar24 = ""[__s1[lVar30]];
                    if (uVar23 != uVar24) goto LAB_00179413;
                    uVar17 = uVar17 - 1;
                    lVar30 = lVar30 + 1;
                    if (uVar17 < 2) goto LAB_001794cb;
                  }
                  uVar24 = ""[__s1[lVar30]];
                  uVar23 = '\0';
LAB_00179413:
                  if (uVar23 != uVar24) goto LAB_0017941f;
                }
LAB_001794cb:
                iVar7 = (int)local_80 + iVar7 + 1;
                goto LAB_001794d7;
              }
LAB_0017941f:
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_48);
            iVar7 = 0;
            uVar27 = (ulong)local_c8;
LAB_001794d7:
            uVar17 = (uint)uVar27;
            pbVar10 = local_f0;
          }
          pFVar15 = local_f8;
          local_80 = CONCAT44(local_80._4_4_,iVar7);
          pbVar10 = pbVar10 + iVar7;
          local_c0 = *(Fts3Expr **)&local_68->iVersion;
          uVar22 = (int)local_e0 - iVar7;
          if (uVar22 != 0 && iVar7 <= (int)local_e0) {
            uVar26 = 0;
            do {
              if (pbVar10[uVar26] == 0x22) goto LAB_00179526;
              uVar26 = uVar26 + 1;
            } while (uVar22 != uVar26);
            uVar26 = (ulong)uVar22;
          }
LAB_00179526:
          iVar31 = (int)uVar26;
          iVar7 = sqlite3Fts3OpenTokenizer
                            ((sqlite3_tokenizer *)local_68,(int)local_50,(char *)pbVar10,iVar31,
                             (sqlite3_tokenizer_cursor **)&local_a8);
          if (iVar7 == 0) {
            local_124 = 0;
            local_104 = 0;
            local_11c = 0;
            local_c4 = 0;
            local_d0 = local_a8;
            iVar7 = (*(code *)local_c0->iDocid)
                              (local_a8,&local_88,&local_124,&local_104,&local_11c,&local_c4);
            if (iVar7 == 0) {
              iVar7 = local_124 + 0xc0;
              pFVar15 = (Fts3Expr *)sqlite3_malloc(iVar7);
              if (pFVar15 == (Fts3Expr *)0x0) {
                local_118 = (void *)CONCAT44(local_118._4_4_,7);
                pFVar15 = local_f8;
                iVar31 = local_11c;
                goto LAB_001795da;
              }
              memset(pFVar15,0,(long)iVar7);
              pFVar15->eType = 5;
              pFVar15->pPhrase = (Fts3Phrase *)(pFVar15 + 1);
              *(undefined4 *)&pFVar15[2].pLeft = 1;
              *(uint *)((long)&pFVar15[2].pLeft + 4) = uVar17;
              *(int *)&pFVar15[2].pPhrase = local_124;
              pFVar15[2].pRight = pFVar15 + 3;
              local_e8 = pFVar15;
              memcpy(pFVar15 + 3,local_88,(long)local_124);
              if ((local_11c < (int)uVar22) && (pbVar10[local_11c] == 0x2a)) {
                *(undefined4 *)((long)&local_e8[2].pPhrase + 4) = 1;
                local_11c = local_11c + 1;
              }
              pFVar15 = local_f8;
              iVar31 = local_11c;
              if ((long)(int)local_104 < 1) {
                local_118 = (void *)((ulong)local_118._4_4_ << 0x20);
                bVar32 = true;
              }
              else {
                bVar32 = false;
                lVar30 = (long)(int)local_104;
                do {
                  bVar34 = true;
                  if (pbVar10[lVar30 + -1] != 0x2d) {
                    if ((local_11d == '\0') || (pbVar10[lVar30 + -1] != 0x5e)) break;
                    *(undefined4 *)&local_e8[2].iDocid = 1;
                    bVar34 = bVar32;
                  }
                  bVar32 = bVar34;
                  local_104 = (uint)(lVar30 + -1);
                  bVar34 = 1 < lVar30;
                  lVar30 = lVar30 + -1;
                } while (bVar34);
                bVar32 = !bVar32;
                local_118 = (void *)((ulong)local_118._4_4_ << 0x20);
              }
            }
            else {
              iVar8 = iVar7;
              if (iVar7 == 0x65) {
                iVar8 = 0;
              }
              if (iVar31 == 0) {
                iVar8 = iVar7;
              }
              local_118 = (void *)CONCAT44(local_118._4_4_,iVar8);
LAB_001795da:
              local_e8 = (Fts3Expr *)0x0;
              bVar32 = true;
            }
            pbVar28 = local_100;
            pCursor = &local_110->base;
            (*(code *)local_c0->pPhrase)(local_d0);
            iVar8 = (int)local_e0;
            pFVar13 = local_e8;
          }
          else {
            local_118 = (void *)CONCAT44(local_118._4_4_,iVar7);
            bVar32 = true;
            iVar8 = (int)local_e0;
            pCursor = &local_110->base;
            pFVar13 = (Fts3Expr *)0x0;
            pbVar28 = local_100;
          }
          iVar31 = iVar31 + (int)local_80;
        }
LAB_00179abe:
        psVar21 = local_b0;
        iVar7 = (uint)local_118;
        if (((uint)local_118 == 0) && (pFVar13 != (Fts3Expr *)0x0)) {
          iVar7 = pFVar13->eType;
          if (iVar7 != 5) {
            bVar34 = pFVar13->pLeft == (Fts3Expr *)0x0;
            bVar32 = !bVar34;
            in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar34);
            if (!bVar34 || local_d4 == 0) goto LAB_00179b22;
            iVar8 = 1;
LAB_0017a1f7:
            sqlite3Fts3ExprFree(pFVar13);
            pbVar28 = local_100;
            pFVar15 = local_f8;
            goto LAB_00179f61;
          }
          if (!bVar32) {
            iVar7 = sqlite3_initialize();
            psVar21 = local_b0;
            iVar8 = 7;
            if ((iVar7 != 0) ||
               (pFVar14 = (Fts3Expr *)sqlite3Malloc(0x40), pFVar14 == (Fts3Expr *)0x0))
            goto LAB_0017a1f7;
            *(undefined8 *)((long)&pFVar14->pLeft + 4) = 0;
            *(undefined8 *)((long)&pFVar14->pRight + 4) = 0;
            pFVar14->bEof = '\0';
            pFVar14->bStart = '\0';
            pFVar14->bDeferred = '\0';
            *(undefined5 *)&pFVar14->field_0x33 = 0;
            pFVar14->aMI = (u32 *)0x0;
            *(undefined8 *)((long)&pFVar14->pPhrase + 4) = 0;
            *(undefined8 *)((long)&pFVar14->iDocid + 4) = 0;
            *(undefined8 *)&pFVar14->nNear = 0;
            *(undefined8 *)((long)&pFVar14->pParent + 4) = 0;
            pFVar14->eType = 2;
            pFVar14->pRight = pFVar13;
            pFVar13->pParent = pFVar14;
            if (pFVar15 != (Fts3Expr *)0x0) {
              pFVar14->pLeft = pFVar15;
              pFVar15->pParent = pFVar14;
            }
            iVar8 = (int)local_e0;
            pbVar28 = local_100;
            pFVar15 = pFVar14;
            iVar7 = 0;
            goto LAB_00179d31;
          }
          bVar32 = true;
          in_R11 = 0;
LAB_00179b22:
          if (local_d4 == 0 && (char)in_R11 == '\0') {
            local_d4 = (uint)in_R11;
            iVar6 = sqlite3_initialize();
            psVar21 = local_b0;
            iVar8 = 7;
            if ((iVar6 != 0) ||
               (pFVar15 = (Fts3Expr *)sqlite3Malloc(0x40), pFVar15 == (Fts3Expr *)0x0))
            goto LAB_0017a1f7;
            pFVar15->bEof = '\0';
            pFVar15->bStart = '\0';
            pFVar15->bDeferred = '\0';
            *(undefined5 *)&pFVar15->field_0x33 = 0;
            pFVar15->aMI = (u32 *)0x0;
            *(undefined8 *)((long)&pFVar15->pPhrase + 4) = 0;
            *(undefined8 *)((long)&pFVar15->iDocid + 4) = 0;
            *(undefined8 *)((long)&pFVar15->pLeft + 4) = 0;
            *(undefined8 *)((long)&pFVar15->pRight + 4) = 0;
            *(undefined8 *)&pFVar15->nNear = 0;
            *(undefined8 *)((long)&pFVar15->pParent + 4) = 0;
            pFVar15->eType = 3;
            pFVar14 = local_a0;
            do {
              pFVar25 = pFVar14;
              pFVar14 = pFVar25->pParent;
            } while (pFVar25->pParent != (Fts3Expr *)0x0);
            pFVar15->pLeft = pFVar25;
            pFVar25->pParent = pFVar15;
            iVar8 = (int)local_e0;
            in_R11 = (ulong)local_d4;
            local_b8 = pFVar15;
LAB_00179bce:
            if (((!(bool)(iVar7 != 1 | bVar32)) && (pFVar15->eType != 5)) ||
               ((!(bool)(bVar32 ^ 1) && iVar7 != 5 && (pFVar15->eType == 1)))) {
              iVar8 = 1;
              goto LAB_0017a1f7;
            }
          }
          else {
            pFVar15 = local_a0;
            if (local_a0 != (Fts3Expr *)0x0) goto LAB_00179bce;
            pFVar15 = (Fts3Expr *)0x0;
          }
          pFVar14 = pFVar13;
          if (bVar32) {
            if (local_b8 != (Fts3Expr *)0x0) {
              pFVar15->pRight = pFVar13;
              pFVar13->pParent = pFVar15;
              pFVar14 = local_b8;
            }
          }
          else {
            do {
              pFVar25 = pFVar15;
              pFVar15 = pFVar25->pParent;
              if (pFVar15 == (Fts3Expr *)0x0) goto LAB_00179d05;
            } while ((pFVar15->eType == 1) ||
                    (pFVar13->eType != 1 && (pFVar15->eType == 4 || pFVar13->eType != 4)));
            pFVar15->pRight = pFVar13;
            pFVar13->pParent = pFVar15;
            pFVar14 = local_b8;
LAB_00179d05:
            pFVar13->pLeft = pFVar25;
            pFVar25->pParent = pFVar13;
          }
          local_d4 = (uint)in_R11 & 0xff;
          pCursor = &local_110->base;
          local_a0 = pFVar13;
          pbVar28 = local_100;
          pFVar15 = local_f8;
          iVar7 = 0;
          local_b8 = pFVar14;
        }
LAB_00179d31:
        sVar12 = (size_t)(uint)(iVar8 - iVar31);
        pbVar10 = local_f0 + iVar31;
        pVal = local_90;
      } while (iVar7 == 0);
LAB_00179d9c:
      psVar4 = local_78;
      iVar8 = 1;
      if (local_d4 == 0) {
        iVar8 = iVar7;
      }
      if (local_b8 == (Fts3Expr *)0x0) {
        iVar8 = iVar7;
      }
      if (iVar7 != 0x65) {
        iVar8 = iVar7;
      }
      if (iVar8 != 0x65) {
LAB_00179f61:
        sqlite3Fts3ExprFree(local_b8);
        sqlite3Fts3ExprFree(pFVar15);
        local_78->pVtab = (sqlite3_vtab *)0x0;
        pFVar15 = (Fts3Expr *)0x0;
LAB_00179fdb:
        psVar4 = local_78;
        sqlite3Fts3ExprFree(pFVar15);
        psVar4->pVtab = (sqlite3_vtab *)0x0;
        if (iVar8 == 1) {
          pcVar16 = sqlite3_mprintf("malformed MATCH expression: [%s]",pbVar28);
        }
        else {
          if (iVar8 != 0x12) {
            return iVar8;
          }
          pcVar16 = sqlite3_mprintf("FTS expression tree is too large (maximum depth %d)",0xc);
        }
        psVar21->zErrMsg = pcVar16;
        return 1;
      }
      if ((pFVar15 == (Fts3Expr *)0x0) || (pFVar13 = pFVar15, local_b8 == (Fts3Expr *)0x0)) {
        iVar8 = 1;
        if (pFVar15 != (Fts3Expr *)0x0) goto LAB_00179f61;
      }
      else {
        do {
          pFVar14 = pFVar13;
          pFVar13 = pFVar14->pLeft;
        } while (pFVar14->pLeft != (Fts3Expr *)0x0);
        pFVar14->pLeft = local_b8;
        local_b8->pParent = pFVar14;
        local_b8 = pFVar15;
      }
      local_78->pVtab = (sqlite3_vtab *)local_b8;
      if (local_b8 == (Fts3Expr *)0x0) goto LAB_00179e14;
      iVar8 = fts3ExprBalance((Fts3Expr **)local_78,0xc);
      pFVar15 = (Fts3Expr *)psVar4->pVtab;
      if ((iVar8 != 0) || (iVar8 = fts3ExprCheckDepth(pFVar15,0xc), iVar8 != 0)) goto LAB_00179fdb;
    }
    psVar21 = (((Fts3Cursor *)pCursor)->base).pVtab;
    local_124 = 0;
    local_104 = 0;
    local_11c = 0;
    fts3EvalAllocateReaders(local_110,pFVar15,(int *)&local_104,&local_11c,&local_124);
    pCursor = &local_110->base;
    if ((1 < (int)local_104 && local_124 == 0) && (psVar21[0x12].field_0xc != '\0')) {
      uVar26 = (ulong)local_104;
      pFVar15 = (Fts3Expr *)sqlite3_malloc(local_11c * 0x10 + local_104 * 0x28);
      if (pFVar15 == (Fts3Expr *)0x0) {
        local_124 = 7;
      }
      else {
        pFVar1 = (Fts3TokenAndCost *)((long)&pFVar15->eType + uVar26 * 5 * 8);
        local_a8 = pFVar15;
        local_88 = pFVar1;
        fts3EvalTokenCosts((Fts3Cursor *)pCursor,(Fts3Expr *)0x0,((Fts3Cursor *)pCursor)->pExpr,
                           (Fts3TokenAndCost **)&local_a8,(Fts3Expr ***)&local_88,&local_124);
        pFVar3 = local_88;
        iVar7 = local_124;
        if (local_124 == 0) {
          iVar31 = (int)((ulong)((long)local_a8 - (long)pFVar15) >> 3) * -0x33333333;
          iVar7 = fts3EvalSelectDeferred
                            ((Fts3Cursor *)pCursor,(Fts3Expr *)0x0,(Fts3TokenAndCost *)pFVar15,
                             iVar31);
          pVal = local_90;
          if ((iVar7 == 0) &&
             (uVar22 = (uint)((ulong)((long)pFVar3 - (long)pFVar1) >> 3), 0 < (int)uVar22)) {
            uVar26 = 1;
            do {
              iVar7 = fts3EvalSelectDeferred
                                ((Fts3Cursor *)pCursor,
                                 *(Fts3Expr **)((long)pFVar1 + uVar26 * 8 + -8),
                                 (Fts3TokenAndCost *)pFVar15,iVar31);
              pVal = local_90;
              if (iVar7 != 0) break;
              bVar32 = uVar26 < (uVar22 & 0x7fffffff);
              uVar26 = uVar26 + 1;
            } while (bVar32);
          }
        }
        local_124 = iVar7;
        sqlite3_free(pFVar15);
      }
    }
    fts3EvalStartReaders((Fts3Cursor *)pCursor,((Fts3Cursor *)pCursor)->pExpr,&local_124);
    psVar21 = local_b0;
    iVar7 = local_124;
    sqlite3_blob_close(*(sqlite3_blob **)&local_b0[0x13].nRef);
    *(undefined8 *)&psVar21[0x13].nRef = 0;
    if (iVar7 != 0) {
      return iVar7;
    }
    ((Fts3Cursor *)pCursor)->pNextId = ((Fts3Cursor *)pCursor)->aDoclist;
    ((Fts3Cursor *)pCursor)->iPrevId = 0;
  }
  ppStmt = &((Fts3Cursor *)pCursor)->pStmt;
  if ((short)local_94 == 1) {
    iVar7 = fts3CursorSeekStmt((Fts3Cursor *)pCursor,ppStmt);
    if (iVar7 != 0) {
      return iVar7;
    }
    iVar7 = sqlite3_bind_value(*ppStmt,1,local_70);
  }
  else {
    if ((local_94 & 0xffff) != 0) goto LAB_0017a172;
    local_60 = (sqlite3_value *)((ulong)local_60 | (ulong)pVal);
    if (local_60 == (sqlite3_value *)0x0) {
      pcVar16 = "DESC";
      if (((Fts3Cursor *)pCursor)->bDesc == '\0') {
        pcVar16 = "ASC";
      }
      pcVar16 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",psVar21[0x11].zErrMsg,pcVar16);
    }
    else {
      pcVar16 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                psVar21[0x11].zErrMsg,((Fts3Cursor *)pCursor)->iMinDocid,
                                ((Fts3Cursor *)pCursor)->iMaxDocid);
    }
    if (pcVar16 == (char *)0x0) {
      return 7;
    }
    iVar7 = sqlite3LockAndPrepare
                      ((sqlite3 *)psVar21[1].pModule,pcVar16,-1,1,(Vdbe *)0x0,ppStmt,(char **)0x0);
    sqlite3_free(pcVar16);
  }
  if (iVar7 != 0) {
    return iVar7;
  }
LAB_0017a172:
  iVar7 = fts3NextMethod(pCursor);
  return iVar7;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr->aDoclist);
  sqlite3_free(pCsr->aMatchinfo);
  sqlite3Fts3ExprFree(pCsr->pExpr);
  memset(&pCursor[1], 0, sizeof(Fts3Cursor)-sizeof(sqlite3_vtab_cursor));

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v2(p->db, zSql, -1, &pCsr->pStmt, 0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr, &pCsr->pStmt);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}